

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int gz_comp(gz_statep state,int flush)

{
  uInt uVar1;
  int iVar2;
  z_stream *strm_00;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  uint local_4c;
  uint local_3c;
  z_streamp strm;
  uint max;
  uint put;
  uint have;
  int writ;
  int ret;
  int flush_local;
  gz_statep state_local;
  
  strm_00 = &state->strm;
  if ((state->size == 0) && (iVar2 = gz_init(state), iVar2 == -1)) {
    state_local._4_4_ = -1;
  }
  else if (state->direct == 0) {
    if (state->reset != 0) {
      if ((state->strm).avail_in == 0) {
        return 0;
      }
      deflateReset(strm_00);
      state->reset = 0;
    }
    have = 0;
    do {
      if (((state->strm).avail_out == 0) || ((flush != 0 && ((flush != 4 || (have == 1)))))) {
        while ((state->x).next < (state->strm).next_out) {
          if ((long)(state->strm).next_out - (long)(state->x).next < 0x40000001) {
            local_4c = (int)(state->strm).next_out - (int)(state->x).next;
          }
          else {
            local_4c = 0x40000000;
          }
          sVar3 = write(state->fd,(state->x).next,(ulong)local_4c);
          if ((int)sVar3 < 0) {
            piVar4 = __errno_location();
            pcVar5 = strerror(*piVar4);
            gz_error(state,-1,pcVar5);
            return -1;
          }
          (state->x).next = (state->x).next + (int)sVar3;
        }
        if ((state->strm).avail_out == 0) {
          (state->strm).avail_out = state->size;
          (state->strm).next_out = state->out;
          (state->x).next = state->out;
        }
      }
      uVar1 = (state->strm).avail_out;
      have = deflate(strm_00,flush);
      if (have == 0xfffffffe) {
        gz_error(state,-2,"internal error: deflate stream corrupt");
        return -1;
      }
    } while (uVar1 != (state->strm).avail_out);
    if (flush == 4) {
      state->reset = 1;
    }
    state_local._4_4_ = 0;
  }
  else {
    while ((state->strm).avail_in != 0) {
      if ((state->strm).avail_in < 0x40000001) {
        local_3c = (state->strm).avail_in;
      }
      else {
        local_3c = 0x40000000;
      }
      sVar3 = write(state->fd,strm_00->next_in,(ulong)local_3c);
      iVar2 = (int)sVar3;
      if (iVar2 < 0) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        gz_error(state,-1,pcVar5);
        return -1;
      }
      (state->strm).avail_in = (state->strm).avail_in - iVar2;
      strm_00->next_in = strm_00->next_in + iVar2;
    }
    state_local._4_4_ = 0;
  }
  return state_local._4_4_;
}

Assistant:

local int gz_comp(gz_statep state, int flush) {
    int ret, writ;
    unsigned have, put, max = ((unsigned)-1 >> 2) + 1;
    z_streamp strm = &(state->strm);

    /* allocate memory if this is the first time through */
    if (state->size == 0 && gz_init(state) == -1)
        return -1;

    /* write directly if requested */
    if (state->direct) {
        while (strm->avail_in) {
            put = strm->avail_in > max ? max : strm->avail_in;
            writ = write(state->fd, strm->next_in, put);
            if (writ < 0) {
                gz_error(state, Z_ERRNO, zstrerror());
                return -1;
            }
            strm->avail_in -= (unsigned)writ;
            strm->next_in += writ;
        }
        return 0;
    }

    /* check for a pending reset */
    if (state->reset) {
        /* don't start a new gzip member unless there is data to write */
        if (strm->avail_in == 0)
            return 0;
        deflateReset(strm);
        state->reset = 0;
    }

    /* run deflate() on provided input until it produces no more output */
    ret = Z_OK;
    do {
        /* write out current buffer contents if full, or if flushing, but if
           doing Z_FINISH then don't write until we get to Z_STREAM_END */
        if (strm->avail_out == 0 || (flush != Z_NO_FLUSH &&
            (flush != Z_FINISH || ret == Z_STREAM_END))) {
            while (strm->next_out > state->x.next) {
                put = strm->next_out - state->x.next > (int)max ? max :
                      (unsigned)(strm->next_out - state->x.next);
                writ = write(state->fd, state->x.next, put);
                if (writ < 0) {
                    gz_error(state, Z_ERRNO, zstrerror());
                    return -1;
                }
                state->x.next += writ;
            }
            if (strm->avail_out == 0) {
                strm->avail_out = state->size;
                strm->next_out = state->out;
                state->x.next = state->out;
            }
        }

        /* compress */
        have = strm->avail_out;
        ret = deflate(strm, flush);
        if (ret == Z_STREAM_ERROR) {
            gz_error(state, Z_STREAM_ERROR,
                      "internal error: deflate stream corrupt");
            return -1;
        }
        have -= strm->avail_out;
    } while (have);

    /* if that completed a deflate stream, allow another to start */
    if (flush == Z_FINISH)
        state->reset = 1;

    /* all done, no errors */
    return 0;
}